

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplatformfontdatabase.cpp
# Opt level: O0

bool operator!=(QSupportedWritingSystems *lhs,QSupportedWritingSystems *rhs)

{
  const_reference pbVar1;
  long *in_RSI;
  long *in_RDI;
  int i;
  qsizetype in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffe0;
  int iVar2;
  
  if (*in_RDI != *in_RSI) {
    for (iVar2 = 0; iVar2 < 0x22; iVar2 = iVar2 + 1) {
      pbVar1 = QList<bool>::at((QList<bool> *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),
                               in_stack_ffffffffffffffd8);
      in_stack_ffffffffffffffe0 = (uint)(*pbVar1 & 1);
      pbVar1 = QList<bool>::at((QList<bool> *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),
                               in_stack_ffffffffffffffd8);
      if (in_stack_ffffffffffffffe0 != (*pbVar1 & 1)) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool operator!=(const QSupportedWritingSystems &lhs, const QSupportedWritingSystems &rhs)
{
    if (lhs.d == rhs.d)
        return false;

    Q_ASSERT(lhs.d->list.size() == rhs.d->list.size());
    Q_ASSERT(lhs.d->list.size() == QFontDatabase::WritingSystemsCount);
    for (int i = 0; i < QFontDatabase::WritingSystemsCount; ++i) {
        if (lhs.d->list.at(i) != rhs.d->list.at(i))
            return true;
    }

    return false;
}